

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_vocab.c
# Opt level: O3

int HashVocab_serialize(HashVocab voc,Serializer serializer,void *param)

{
  (*serializer)((char *)&voc->bound_,8,param);
  (*serializer)((char *)voc,8,param);
  (*serializer)((char *)(voc->tb).begin_,(voc->tb).buckets_ << 4,param);
  (*serializer)((char *)voc->words,voc->bound_ << 2,param);
  (*serializer)(voc->word_strs,voc->word_strs_used_size,param);
  return 0;
}

Assistant:

int HashVocab_serialize(const HashVocab voc, Serializer serializer, void* param){
    //printf("serialize, bound:%d, buckets:%d\n", voc->bound_,voc->tb.buckets_);
    serializer((char*)&(voc->bound_), sizeof(voc->bound_), param);
    serializer((char*)&(voc->tb.buckets_), sizeof(voc->tb.buckets_), param);
    serializer((char*)voc->tb.begin_, sizeof(ProbingVocabularyEntry_T)* voc->tb.buckets_, param);
    serializer((char*)voc->words, sizeof(uint32_t)*voc->bound_, param);
    serializer((char*)voc->word_strs, voc->word_strs_used_size, param);
    return 0;
}